

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_data.cc
# Opt level: O1

void re2c::keygen<unsigned_int>(FILE *f,size_t count,size_t len,size_t len_match,rule_rank_t match)

{
  int iVar1;
  ulong __n;
  uint uVar2;
  void *__ptr;
  long lVar3;
  ulong uVar4;
  undefined4 *puVar5;
  uint m;
  uint m_1;
  uint m_2;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  size_t local_40;
  FILE *local_38;
  
  local_38 = (FILE *)f;
  uVar2 = Skeleton::rule2key<unsigned_int>((rule_rank_t)0x0);
  __n = count * 3;
  uVar4 = 0;
  local_40 = count;
  __ptr = operator_new__(-(ulong)(__n >> 0x3e != 0) | count * 0xc);
  if (local_40 != 0) {
    do {
      lVar3 = 0;
      puVar5 = &local_4c;
      do {
        *(char *)puVar5 = (char)((uint)len >> ((byte)lVar3 & 0x1f));
        lVar3 = lVar3 + 8;
        puVar5 = (undefined4 *)((long)puVar5 + 1);
      } while (lVar3 != 0x20);
      *(undefined4 *)((long)__ptr + uVar4 * 4) = local_4c;
      lVar3 = 0;
      puVar5 = &local_48;
      do {
        *(char *)puVar5 = (char)((uint)len_match >> ((byte)lVar3 & 0x1f));
        lVar3 = lVar3 + 8;
        puVar5 = (undefined4 *)((long)puVar5 + 1);
      } while (lVar3 != 0x20);
      iVar1 = (int)uVar4;
      *(undefined4 *)((long)__ptr + (ulong)(iVar1 + 1) * 4) = local_48;
      lVar3 = 0;
      puVar5 = &local_44;
      do {
        *(char *)puVar5 = (char)(uVar2 >> ((byte)lVar3 & 0x1f));
        lVar3 = lVar3 + 8;
        puVar5 = (undefined4 *)((long)puVar5 + 1);
      } while (lVar3 != 0x20);
      uVar4 = (ulong)(iVar1 + 3);
      *(undefined4 *)((long)__ptr + (ulong)(iVar1 + 2) * 4) = local_44;
    } while (uVar4 < __n);
  }
  fwrite(__ptr,4,__n,local_38);
  operator_delete__(__ptr);
  return;
}

Assistant:

static void keygen (FILE * f, size_t count, size_t len, size_t len_match, rule_rank_t match)
{
	const key_t m = Skeleton::rule2key<key_t> (match);

	const size_t keys_size = 3 * count;
	key_t * keys = new key_t [keys_size];
	for (uint32_t i = 0; i < keys_size;)
	{
		keys[i++] = to_le<key_t>(static_cast<key_t> (len));
		keys[i++] = to_le<key_t>(static_cast<key_t> (len_match));
		keys[i++] = to_le<key_t>(m);
	}
	fwrite (keys, sizeof (key_t), keys_size, f);
	delete [] keys;
}